

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O3

void __thiscall RVO::RVOSimulator::~RVOSimulator(RVOSimulator *this)

{
  Agent *pAVar1;
  pointer pLVar2;
  pointer ppVar3;
  pointer ppVar4;
  KdTree *this_00;
  pointer ppAVar5;
  pointer ppOVar6;
  ulong uVar7;
  
  pAVar1 = this->defaultAgent_;
  if (pAVar1 != (Agent *)0x0) {
    pLVar2 = (pAVar1->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pLVar2 != (pointer)0x0) {
      operator_delete(pLVar2,(long)(pAVar1->orcaLines_).
                                   super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage - (long)pLVar2);
    }
    ppVar3 = (pAVar1->obstacleNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar3 != (pointer)0x0) {
      operator_delete(ppVar3,(long)(pAVar1->obstacleNeighbors_).
                                   super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar3
                     );
    }
    ppVar4 = (pAVar1->agentNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar4 != (pointer)0x0) {
      operator_delete(ppVar4,(long)(pAVar1->agentNeighbors_).
                                   super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar4
                     );
    }
    operator_delete(pAVar1,0x98);
  }
  ppAVar5 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar5) {
    uVar7 = 0;
    do {
      pAVar1 = ppAVar5[uVar7];
      if (pAVar1 != (Agent *)0x0) {
        pLVar2 = (pAVar1->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pLVar2 != (pointer)0x0) {
          operator_delete(pLVar2,(long)(pAVar1->orcaLines_).
                                       super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pLVar2);
        }
        ppVar3 = (pAVar1->obstacleNeighbors_).
                 super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar3 != (pointer)0x0) {
          operator_delete(ppVar3,(long)(pAVar1->obstacleNeighbors_).
                                       super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ppVar3);
        }
        ppVar4 = (pAVar1->agentNeighbors_).
                 super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar4 != (pointer)0x0) {
          operator_delete(ppVar4,(long)(pAVar1->agentNeighbors_).
                                       super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ppVar4);
        }
      }
      operator_delete(pAVar1,0x98);
      uVar7 = uVar7 + 1;
      ppAVar5 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->agents_).
                                   super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar5 >> 3));
  }
  ppOVar6 = (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppOVar6) {
    uVar7 = 0;
    do {
      operator_delete(ppOVar6[uVar7],0x30);
      uVar7 = uVar7 + 1;
      ppOVar6 = (this->obstacles_).
                super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->obstacles_).
                                   super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar6 >> 3))
    ;
  }
  this_00 = this->kdTree_;
  if (this_00 != (KdTree *)0x0) {
    KdTree::~KdTree(this_00);
  }
  operator_delete(this_00,0x40);
  ppOVar6 = (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppOVar6 != (pointer)0x0) {
    operator_delete(ppOVar6,(long)(this->obstacles_).
                                  super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar6
                   );
  }
  ppAVar5 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar5 != (pointer)0x0) {
    operator_delete(ppAVar5,(long)(this->agents_).
                                  super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar5)
    ;
    return;
  }
  return;
}

Assistant:

RVOSimulator::~RVOSimulator()
	{
		if (defaultAgent_ != NULL) {
			delete defaultAgent_;
		}

		for (size_t i = 0; i < agents_.size(); ++i) {
			delete agents_[i];
		}

		for (size_t i = 0; i < obstacles_.size(); ++i) {
			delete obstacles_[i];
		}

		delete kdTree_;
	}